

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cdt.cpp
# Opt level: O3

void __thiscall CDT::set(CDT *this,DataSet *dataset,uint n_input,bool dc_sort)

{
  double dVar1;
  _func_void_Matrix<double>_ptr_void_ptr *p_Var2;
  _func_void_Matrix<double>_ptr_void_ptr *p_Var3;
  _func_void_Matrix<double>_ptr_void_ptr *p_Var4;
  _func_void_Matrix<double>_ptr_void_ptr *p_Var5;
  _func_void_Matrix<double>_ptr_void_ptr *p_Var6;
  uint uVar7;
  pointer pMVar8;
  undefined3 in_register_00000009;
  Shape SVar9;
  vector<Matrix<double>,_std::allocator<Matrix<double>_>_> matrices;
  vector<Matrix<double>,_std::allocator<Matrix<double>_>_> local_38;
  
  std::__cxx11::string::_M_assign((string *)this);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::operator=(&(this->m_dataset).m_labels,&dataset->m_labels);
  uVar7 = (dataset->m_matrix).m_shape.n_col;
  (this->m_dataset).m_matrix.m_shape.n_row = (dataset->m_matrix).m_shape.n_row;
  (this->m_dataset).m_matrix.m_shape.n_col = uVar7;
  (this->m_dataset).m_matrix.m_shape.is_diogonal = (dataset->m_matrix).m_shape.is_diogonal;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=(&(this->m_dataset).m_matrix.m_elems,&(dataset->m_matrix).m_elems);
  p_Var2 = (dataset->m_matrix).m_functions[1];
  p_Var3 = (dataset->m_matrix).m_functions[2];
  p_Var4 = (dataset->m_matrix).m_functions[3];
  p_Var5 = (dataset->m_matrix).m_functions[4];
  p_Var6 = (dataset->m_matrix).m_functions[5];
  (this->m_dataset).m_matrix.m_functions[0] = (dataset->m_matrix).m_functions[0];
  (this->m_dataset).m_matrix.m_functions[1] = p_Var2;
  (this->m_dataset).m_matrix.m_functions[2] = p_Var3;
  (this->m_dataset).m_matrix.m_functions[3] = p_Var4;
  (this->m_dataset).m_matrix.m_functions[4] = p_Var5;
  (this->m_dataset).m_matrix.m_functions[5] = p_Var6;
  (this->m_dataset).m_matrix.m_functions[6] = (dataset->m_matrix).m_functions[6];
  std::vector<Layer,_std::allocator<Layer>_>::resize(&this->m_layers,3);
  SVar9 = DataSet::shape(dataset);
  dVar1 = DataSet::biased(&this->m_dataset);
  (this->m_info).bias = dVar1;
  if (CONCAT31(in_register_00000009,dc_sort) != 0) {
    DataSet::dc_sort(&this->m_dataset);
  }
  DataSet::compile(&local_38,&this->m_dataset,SVar9.n_col - n_input);
  pMVar8 = local_38.super__Vector_base<Matrix<double>,_std::allocator<Matrix<double>_>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->m_input).m_shape.is_diogonal =
       ((local_38.super__Vector_base<Matrix<double>,_std::allocator<Matrix<double>_>_>._M_impl.
         super__Vector_impl_data._M_start)->m_shape).is_diogonal;
  uVar7 = ((local_38.super__Vector_base<Matrix<double>,_std::allocator<Matrix<double>_>_>._M_impl.
            super__Vector_impl_data._M_start)->m_shape).n_col;
  (this->m_input).m_shape.n_row =
       ((local_38.super__Vector_base<Matrix<double>,_std::allocator<Matrix<double>_>_>._M_impl.
         super__Vector_impl_data._M_start)->m_shape).n_row;
  (this->m_input).m_shape.n_col = uVar7;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=(&(this->m_input).m_elems,
              &(local_38.super__Vector_base<Matrix<double>,_std::allocator<Matrix<double>_>_>.
                _M_impl.super__Vector_impl_data._M_start)->m_elems);
  (this->m_input).m_functions[6] = pMVar8->m_functions[6];
  p_Var2 = pMVar8->m_functions[0];
  p_Var3 = pMVar8->m_functions[1];
  p_Var4 = pMVar8->m_functions[2];
  p_Var5 = pMVar8->m_functions[3];
  p_Var6 = pMVar8->m_functions[5];
  (this->m_input).m_functions[4] = pMVar8->m_functions[4];
  (this->m_input).m_functions[5] = p_Var6;
  (this->m_input).m_functions[2] = p_Var4;
  (this->m_input).m_functions[3] = p_Var5;
  (this->m_input).m_functions[0] = p_Var2;
  (this->m_input).m_functions[1] = p_Var3;
  (this->m_output).m_shape.is_diogonal =
       local_38.super__Vector_base<Matrix<double>,_std::allocator<Matrix<double>_>_>._M_impl.
       super__Vector_impl_data._M_start[1].m_shape.is_diogonal;
  uVar7 = local_38.super__Vector_base<Matrix<double>,_std::allocator<Matrix<double>_>_>._M_impl.
          super__Vector_impl_data._M_start[1].m_shape.n_col;
  (this->m_output).m_shape.n_row =
       local_38.super__Vector_base<Matrix<double>,_std::allocator<Matrix<double>_>_>._M_impl.
       super__Vector_impl_data._M_start[1].m_shape.n_row;
  (this->m_output).m_shape.n_col = uVar7;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=(&(this->m_output).m_elems,
              &local_38.super__Vector_base<Matrix<double>,_std::allocator<Matrix<double>_>_>._M_impl
               .super__Vector_impl_data._M_start[1].m_elems);
  (this->m_output).m_functions[6] =
       local_38.super__Vector_base<Matrix<double>,_std::allocator<Matrix<double>_>_>._M_impl.
       super__Vector_impl_data._M_start[1].m_functions[6];
  p_Var2 = local_38.super__Vector_base<Matrix<double>,_std::allocator<Matrix<double>_>_>._M_impl.
           super__Vector_impl_data._M_start[1].m_functions[0];
  p_Var3 = local_38.super__Vector_base<Matrix<double>,_std::allocator<Matrix<double>_>_>._M_impl.
           super__Vector_impl_data._M_start[1].m_functions[1];
  p_Var4 = local_38.super__Vector_base<Matrix<double>,_std::allocator<Matrix<double>_>_>._M_impl.
           super__Vector_impl_data._M_start[1].m_functions[2];
  p_Var5 = local_38.super__Vector_base<Matrix<double>,_std::allocator<Matrix<double>_>_>._M_impl.
           super__Vector_impl_data._M_start[1].m_functions[3];
  p_Var6 = local_38.super__Vector_base<Matrix<double>,_std::allocator<Matrix<double>_>_>._M_impl.
           super__Vector_impl_data._M_start[1].m_functions[5];
  (this->m_output).m_functions[4] =
       local_38.super__Vector_base<Matrix<double>,_std::allocator<Matrix<double>_>_>._M_impl.
       super__Vector_impl_data._M_start[1].m_functions[4];
  (this->m_output).m_functions[5] = p_Var6;
  (this->m_output).m_functions[2] = p_Var4;
  (this->m_output).m_functions[3] = p_Var5;
  (this->m_output).m_functions[0] = p_Var2;
  (this->m_output).m_functions[1] = p_Var3;
  std::vector<Matrix<double>,_std::allocator<Matrix<double>_>_>::~vector(&local_38);
  return;
}

Assistant:

void CDT::set(const DataSet& dataset, unsigned n_input, bool dc_sort){
    m_dataset=dataset;
    m_layers.resize(3);
    
    unsigned n_output=dataset.shape().n_col-n_input;
    m_info.bias=m_dataset.biased();
    if(dc_sort) m_dataset.dc_sort();

    std::vector<Matrix_d> matrices=m_dataset.compile(n_output);
    m_input=matrices[0];
    m_output=matrices[1];
}